

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_cpp_generator.cc
# Opt level: O0

void __thiscall
t_cpp_generator::generate_enum_to_string_helper_function_decl
          (t_cpp_generator *this,ostream *out,t_enum *tenum)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar2;
  t_enum *tenum_local;
  ostream *out_local;
  t_cpp_generator *this_local;
  
  std::operator<<(out,"std::string to_string(const ");
  if ((this->gen_pure_enums_ & 1U) == 0) {
    iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
    poVar2 = std::operator<<(out,(string *)CONCAT44(extraout_var_00,iVar1));
    std::operator<<(poVar2,"::type&");
  }
  else {
    iVar1 = (*(tenum->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator<<(out,(string *)CONCAT44(extraout_var,iVar1));
  }
  poVar2 = std::operator<<(out," val);");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::operator<<(out,(string *)&::endl_abi_cxx11_);
  return;
}

Assistant:

void t_cpp_generator::generate_enum_to_string_helper_function_decl(std::ostream& out, t_enum* tenum) {
  out << "std::string to_string(const ";
  if (gen_pure_enums_) {
    out << tenum->get_name();
  } else {
    out << tenum->get_name() << "::type&";
  }
  out << " val);" << endl;
  out << endl;
}